

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * ImFileLoadToMemory(char *filename,char *mode,size_t *out_file_size,int padding_bytes)

{
  ImFileHandle f_00;
  ImU64 sz;
  ImU64 IVar1;
  int in_ECX;
  ImU64 *in_RDX;
  long in_RSI;
  long in_RDI;
  void *file_data;
  size_t file_size;
  ImFileHandle f;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar2;
  char *in_stack_ffffffffffffffc0;
  void *local_8;
  
  uVar2 = in_RDI != 0 && in_RSI != 0;
  if (in_RDI == 0 || in_RSI == 0) {
    __assert_fail("filename && mode",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x63a,"void *ImFileLoadToMemory(const char *, const char *, size_t *, int)");
  }
  if (in_RDX != (ImU64 *)0x0) {
    *in_RDX = 0;
  }
  f_00 = ImFileOpen(in_stack_ffffffffffffffc0,(char *)CONCAT17(uVar2,in_stack_ffffffffffffffb8));
  if (f_00 == (ImFileHandle)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    sz = ImFileGetSize(f_00);
    if (sz == 0xffffffffffffffff) {
      ImFileClose((ImFileHandle)0x1726da);
      local_8 = (void *)0x0;
    }
    else {
      local_8 = ImGui::MemAlloc((size_t)in_stack_ffffffffffffffc0);
      if (local_8 == (void *)0x0) {
        ImFileClose((ImFileHandle)0x172711);
        local_8 = (void *)0x0;
      }
      else {
        IVar1 = ImFileRead(f_00,sz,(ImU64)local_8,
                           (ImFileHandle)CONCAT17(uVar2,in_stack_ffffffffffffffb8));
        if (IVar1 == sz) {
          if (0 < in_ECX) {
            memset((void *)((long)local_8 + sz),0,(long)in_ECX);
          }
          ImFileClose((ImFileHandle)0x172785);
          if (in_RDX != (ImU64 *)0x0) {
            *in_RDX = sz;
          }
        }
        else {
          ImFileClose((ImFileHandle)0x172749);
          ImGui::MemFree(local_8);
          local_8 = (void *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

void*   ImFileLoadToMemory(const char* filename, const char* mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && mode);
    if (out_file_size)
        *out_file_size = 0;

    ImFileHandle f;
    if ((f = ImFileOpen(filename, mode)) == NULL)
        return NULL;

    size_t file_size = (size_t)ImFileGetSize(f);
    if (file_size == (size_t)-1)
    {
        ImFileClose(f);
        return NULL;
    }

    void* file_data = IM_ALLOC(file_size + padding_bytes);
    if (file_data == NULL)
    {
        ImFileClose(f);
        return NULL;
    }
    if (ImFileRead(file_data, 1, file_size, f) != file_size)
    {
        ImFileClose(f);
        IM_FREE(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    ImFileClose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}